

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O1

uint32_t crc32_vpclmulqdq(uint32_t crc32,uint8_t *buf,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  crc32_fold crc_state;
  undefined1 local_58 [16];
  uint8_t local_48 [64];
  
  if (len < 0x10) {
    if (len != 0) {
      uVar13 = ~crc32;
      sVar14 = 0;
      do {
        uVar13 = uVar13 >> 8 ^ crc_table[(byte)(buf[sVar14] ^ (byte)uVar13)];
        sVar14 = sVar14 + 1;
      } while (len != sVar14);
      return ~uVar13;
    }
  }
  else {
    local_58 = SUB6416(ZEXT464(0x9db42487),0);
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[0x18] = '\0';
    local_48[0x19] = '\0';
    local_48[0x1a] = '\0';
    local_48[0x1b] = '\0';
    local_48[0x1c] = '\0';
    local_48[0x1d] = '\0';
    local_48[0x1e] = '\0';
    local_48[0x1f] = '\0';
    local_48[0x20] = '\0';
    local_48[0x21] = '\0';
    local_48[0x22] = '\0';
    local_48[0x23] = '\0';
    local_48[0x24] = '\0';
    local_48[0x25] = '\0';
    local_48[0x26] = '\0';
    local_48[0x27] = '\0';
    local_48[0x28] = '\0';
    local_48[0x29] = '\0';
    local_48[0x2a] = '\0';
    local_48[0x2b] = '\0';
    local_48[0x2c] = '\0';
    local_48[0x2d] = '\0';
    local_48[0x2e] = '\0';
    local_48[0x2f] = '\0';
    crc32_fold_vpclmulqdq((crc32_fold *)local_58,buf,len,crc32);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_58._0_8_;
    auVar1 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar15 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ ZEXT816(0x1751997d0) << uVar13;
      }
    }
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_58._8_8_;
    auVar15 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar16 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar15 = auVar15 ^ ZEXT816(0xccaa009e) << uVar13;
      }
    }
    auVar10[8] = local_48[8];
    auVar10[9] = local_48[9];
    auVar10[10] = local_48[10];
    auVar10[0xb] = local_48[0xb];
    auVar10[0xc] = local_48[0xc];
    auVar10[0xd] = local_48[0xd];
    auVar10[0xe] = local_48[0xe];
    auVar10[0xf] = local_48[0xf];
    auVar10[0] = local_48[0];
    auVar10[1] = local_48[1];
    auVar10[2] = local_48[2];
    auVar10[3] = local_48[3];
    auVar10[4] = local_48[4];
    auVar10[5] = local_48[5];
    auVar10[6] = local_48[6];
    auVar10[7] = local_48[7];
    auVar15 = vpternlogq_avx512vl(auVar15,auVar1,auVar10,0x96);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = auVar15._0_8_;
    auVar1 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar6 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ ZEXT816(0x1751997d0) << uVar13;
      }
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar15._8_8_;
    auVar15 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar4 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar15 = auVar15 ^ ZEXT816(0xccaa009e) << uVar13;
      }
    }
    auVar11[8] = local_48[0x18];
    auVar11[9] = local_48[0x19];
    auVar11[10] = local_48[0x1a];
    auVar11[0xb] = local_48[0x1b];
    auVar11[0xc] = local_48[0x1c];
    auVar11[0xd] = local_48[0x1d];
    auVar11[0xe] = local_48[0x1e];
    auVar11[0xf] = local_48[0x1f];
    auVar11[0] = local_48[0x10];
    auVar11[1] = local_48[0x11];
    auVar11[2] = local_48[0x12];
    auVar11[3] = local_48[0x13];
    auVar11[4] = local_48[0x14];
    auVar11[5] = local_48[0x15];
    auVar11[6] = local_48[0x16];
    auVar11[7] = local_48[0x17];
    auVar15 = vpternlogq_avx512vl(auVar15,auVar1,auVar11,0x96);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar15._0_8_;
    auVar1 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ ZEXT816(0x1751997d0) << uVar13;
      }
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = auVar15._8_8_;
    auVar15 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar5 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar15 = auVar15 ^ ZEXT816(0xccaa009e) << uVar13;
      }
    }
    auVar12[8] = local_48[0x28];
    auVar12[9] = local_48[0x29];
    auVar12[10] = local_48[0x2a];
    auVar12[0xb] = local_48[0x2b];
    auVar12[0xc] = local_48[0x2c];
    auVar12[0xd] = local_48[0x2d];
    auVar12[0xe] = local_48[0x2e];
    auVar12[0xf] = local_48[0x2f];
    auVar12[0] = local_48[0x20];
    auVar12[1] = local_48[0x21];
    auVar12[2] = local_48[0x22];
    auVar12[3] = local_48[0x23];
    auVar12[4] = local_48[0x24];
    auVar12[5] = local_48[0x25];
    auVar12[6] = local_48[0x26];
    auVar12[7] = local_48[0x27];
    auVar15 = vpternlogq_avx512vl(auVar15,auVar1,auVar12,0x96);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar15._0_8_;
    auVar1 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar2 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ ZEXT816(0xccaa009e) << uVar13;
      }
    }
    auVar16 = vpsrldq_avx(auVar15,8);
    auVar15 = vpsllq_avx(auVar1 ^ auVar16,0x20);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar15._0_8_;
    auVar15 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar8 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar15 = auVar15 ^ ZEXT816(0x163cd6124) << uVar13;
      }
    }
    auVar15 = auVar1 ^ auVar16 ^ auVar15;
    auVar1 = vpblendd_avx2(auVar15,(undefined1  [16])0x0,1);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar1._0_8_;
    auVar16 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar3 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar16 = auVar16 ^ ZEXT816(0x1f7011640) << uVar13;
      }
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar1._0_8_ ^ auVar16._0_8_;
    auVar1 = (undefined1  [16])0x0;
    for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + 1) {
      if ((auVar9 & (undefined1  [16])0x1 << uVar13) != (undefined1  [16])0x0) {
        auVar1 = auVar1 ^ ZEXT816(0x1db710640) << uVar13;
      }
    }
    crc32 = ~(auVar15._8_4_ ^ auVar1._8_4_);
  }
  return crc32;
}

Assistant:

Z_INTERNAL uint32_t CRC32(uint32_t crc32, const uint8_t *buf, size_t len) {
    /* For lens smaller than ~12, crc32_small method is faster.
     * But there are also minimum requirements for the pclmul functions due to alignment */
    if (len < 16)
        return crc32_small(crc32, buf, len);

    crc32_fold ALIGNED_(16) crc_state;
    CRC32_FOLD_RESET(&crc_state);
    CRC32_FOLD(&crc_state, buf, len, crc32);
    return CRC32_FOLD_FINAL(&crc_state);
}